

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O2

void __thiscall grib2dec_demo::Output::Output(Output *this,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  
  this->_vptr_Output = (_func_int **)&PTR___cxa_pure_virtual_00106c88;
  if (filename->_M_string_length != 0) {
    bVar1 = std::operator==(filename,"-");
    if (!bVar1) {
      poVar2 = (ostream *)&this->fileOut;
      goto LAB_001029a9;
    }
  }
  poVar2 = (ostream *)&std::cout;
LAB_001029a9:
  this->out = poVar2;
  std::ofstream::ofstream(&this->fileOut);
  if (filename->_M_string_length != 0) {
    bVar1 = std::operator!=(filename,"-");
    if (bVar1) {
      std::ofstream::open((string *)&this->fileOut,(_Ios_Openmode)filename);
    }
  }
  return;
}

Assistant:

Output::Output(const string& filename)
    : out(filename.empty() || filename == "-" ? cout : fileOut)
{
    if (!filename.empty() && filename != "-")
        fileOut.open(filename);
}